

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_hmask.c
# Opt level: O1

void aom_highbd_blend_a64_hmask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,int w,int h,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  if (0 < h) {
    iVar5 = 0;
    iVar6 = 0;
    iVar3 = 0;
    iVar2 = 0;
    do {
      if (0 < w) {
        uVar4 = 0;
        do {
          iVar1 = (int)uVar4;
          *(short *)((long)dst_8 * 2 + (ulong)(uint)(iVar3 + iVar1) * 2) =
               (short)((uint)*(ushort *)((long)src1_8 * 2 + (ulong)(uint)(iVar6 + iVar1) * 2) *
                       (0x40 - (uint)mask[uVar4]) +
                       (uint)*(ushort *)((long)src0_8 * 2 + (ulong)(uint)(iVar5 + iVar1) * 2) *
                       (uint)mask[uVar4] + 0x20 >> 6);
          uVar4 = uVar4 + 1;
        } while ((uint)w != uVar4);
      }
      iVar2 = iVar2 + 1;
      iVar3 = iVar3 + dst_stride;
      iVar6 = iVar6 + src1_stride;
      iVar5 = iVar5 + src0_stride;
    } while (iVar2 != h);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_hmask_c(uint8_t *dst_8, uint32_t dst_stride,
                                  const uint8_t *src0_8, uint32_t src0_stride,
                                  const uint8_t *src1_8, uint32_t src1_stride,
                                  const uint8_t *mask, int w, int h, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      dst[i * dst_stride + j] = AOM_BLEND_A64(
          mask[j], src0[i * src0_stride + j], src1[i * src1_stride + j]);
    }
  }
}